

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O0

void __thiscall
OctreeTracer::create_main_graphics_pipeline
          (OctreeTracer *this,shared_ptr<myvk::RenderPass> *render_pass,uint32_t subpass)

{
  initializer_list<VkPipelineShaderStageCreateInfo> __l;
  initializer_list<VkDynamicState> __l_00;
  element_type *peVar1;
  GraphicsPipelineState pipeline_state;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  shared_ptr<myvk::ShaderModule> frag_shader_module;
  shared_ptr<myvk::ShaderModule> vert_shader_module;
  shared_ptr<myvk::Device> device;
  uint32_t kOctreeTracerFragSpv [3713];
  shared_ptr<myvk::Device> *in_stack_ffffffffffffc1b8;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> *dynamic_states;
  shared_ptr<myvk::Device> *in_stack_ffffffffffffc1c0;
  GraphicsPipelineState *this_00;
  VkSpecializationInfo *in_stack_ffffffffffffc1d0;
  pointer this_01;
  VkShaderStageFlagBits in_stack_ffffffffffffc1dc;
  ShaderModule *in_stack_ffffffffffffc1e0;
  VertexInputState *this_02;
  allocator_type *__a;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> *this_03;
  iterator pVVar2;
  char **ppcVar3;
  VkBool32 in_stack_ffffffffffffc228;
  uint32_t in_stack_ffffffffffffc22c;
  undefined4 in_stack_ffffffffffffc230;
  undefined4 in_stack_ffffffffffffc234;
  undefined8 in_stack_ffffffffffffc238;
  uint32_t uVar4;
  uint32_t *in_stack_ffffffffffffc240;
  Ptr<Device> *in_stack_ffffffffffffc248;
  RasterizationState local_3da0;
  pointer local_3d60;
  pointer pVStack_3d58;
  pointer local_3d50;
  pointer local_3d48;
  pointer pVStack_3d40;
  pointer local_3d38;
  VkStructureType local_3d30;
  void *local_3d28;
  VkPipelineVertexInputStateCreateFlags local_3d20;
  uint32_t local_3d1c;
  uint32_t uVar5;
  undefined4 in_stack_ffffffffffffc2f4;
  VkVertexInputAttributeDescription *shader_stages_00;
  bool bVar6;
  undefined7 in_stack_ffffffffffffc301;
  VkStructureType VVar7;
  undefined4 in_stack_ffffffffffffc30c;
  ViewportState local_3cb0;
  MultisampleState local_3c48;
  undefined4 local_3c10;
  undefined8 local_3c08;
  undefined4 local_3c00;
  undefined4 local_3bfc;
  undefined4 local_3bf8;
  undefined4 local_3bf4;
  undefined4 local_3bf0;
  undefined4 local_3bec;
  undefined8 uStack_3be8;
  undefined4 uStack_3be0;
  undefined4 local_3bdc;
  undefined4 uStack_3bd8;
  pointer pVStack_3bd4;
  undefined8 uStack_3bcc;
  undefined4 uStack_3bc4;
  undefined4 local_3bc0;
  undefined4 uStack_3bbc;
  pointer pVStack_3bb8;
  undefined4 local_3bb0;
  undefined4 local_3bac;
  undefined1 local_3ba8;
  undefined8 local_3ba0;
  pointer pVStack_3b98;
  float local_3b90 [4];
  undefined8 local_3b80;
  undefined4 local_3b78;
  undefined4 local_3b74;
  undefined4 local_3b70;
  undefined4 local_3b6c;
  undefined8 local_3b68;
  undefined8 local_3b60;
  pointer pVStack_3b58;
  undefined1 local_3b50;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> local_3b48;
  undefined4 local_3b30;
  undefined8 local_3b28;
  undefined4 local_3b20;
  undefined4 local_3b1c;
  undefined8 local_3b18;
  undefined1 local_3b10;
  allocator_type local_3b01;
  undefined1 local_3b00 [48];
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> local_3ad0 [2];
  undefined1 *local_3aa0;
  undefined8 local_3a98;
  VkPipelineShaderStageCreateInfo local_3a78 [2];
  undefined1 local_3a18 [14872];
  
  uVar4 = SUB84(in_stack_ffffffffffffc238,4);
  memcpy(local_3a18,&DAT_003c7a10,0x3a04);
  peVar1 = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x162431);
  (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  std::shared_ptr<myvk::Device>::shared_ptr(in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1b8);
  std::shared_ptr<myvk::ShaderModule>::shared_ptr((shared_ptr<myvk::ShaderModule> *)0x16245f);
  std::shared_ptr<myvk::ShaderModule>::shared_ptr((shared_ptr<myvk::ShaderModule> *)0x16246c);
  myvk::ShaderModule::Create(in_stack_ffffffffffffc248,in_stack_ffffffffffffc240,uVar4);
  ppcVar3 = &local_3a78[0].pName;
  std::shared_ptr<myvk::ShaderModule>::operator=
            ((shared_ptr<myvk::ShaderModule> *)in_stack_ffffffffffffc1c0,
             (shared_ptr<myvk::ShaderModule> *)in_stack_ffffffffffffc1b8);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x1624b0);
  myvk::ShaderModule::Create(in_stack_ffffffffffffc248,in_stack_ffffffffffffc240,uVar4);
  pVVar2 = local_3a78;
  std::shared_ptr<myvk::ShaderModule>::operator=
            ((shared_ptr<myvk::ShaderModule> *)in_stack_ffffffffffffc1c0,
             (shared_ptr<myvk::ShaderModule> *)in_stack_ffffffffffffc1b8);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x1624f8);
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x162505);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_ffffffffffffc1e0,in_stack_ffffffffffffc1dc,in_stack_ffffffffffffc1d0);
  this_03 = local_3ad0;
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16253a);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_ffffffffffffc1e0,in_stack_ffffffffffffc1dc,in_stack_ffffffffffffc1d0);
  local_3aa0 = local_3b00;
  local_3a98 = 2;
  __a = &local_3b01;
  std::allocator<VkPipelineShaderStageCreateInfo>::allocator
            ((allocator<VkPipelineShaderStageCreateInfo> *)0x162580);
  __l._M_len = (size_type)ppcVar3;
  __l._M_array = pVVar2;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *)this_03,__l,__a);
  std::allocator<VkPipelineShaderStageCreateInfo>::~allocator(&local_3b01);
  local_3da0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_3da0.m_create_info.pNext = (void *)0x0;
  local_3da0.m_create_info.flags = 0;
  local_3da0.m_create_info.depthClampEnable = 0;
  local_3da0.m_create_info.rasterizerDiscardEnable = 0;
  local_3da0.m_create_info.polygonMode = VK_POLYGON_MODE_FILL;
  local_3da0.m_create_info.cullMode = 0;
  local_3da0.m_create_info.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  local_3da0.m_create_info.depthBiasEnable = 0;
  local_3da0.m_create_info.depthBiasConstantFactor = 0.0;
  local_3da0.m_create_info.depthBiasClamp = 0.0;
  local_3da0.m_create_info.depthBiasSlopeFactor = 0.0;
  local_3da0.m_create_info.lineWidth = 0.0;
  this_02 = (VertexInputState *)&local_3d60;
  this_01 = (pointer)0x0;
  local_3d60 = (pointer)0x0;
  pVStack_3d58 = (pointer)0x0;
  local_3d50 = (pointer)0x0;
  std::vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>::
  vector((vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
          *)0x16266f);
  local_3d48 = (pointer)0x0;
  local_3d38 = (pointer)0x0;
  pVStack_3d40 = this_01;
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::vector((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
            *)0x162695);
  local_3d30 = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_3d28 = (void *)0x0;
  local_3d20 = 0;
  local_3d1c = 0;
  uVar4 = 0;
  uVar5 = 0;
  shader_stages_00 = (VkVertexInputAttributeDescription *)0x0;
  bVar6 = false;
  VVar7 = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_3cb0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3cb0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3cb0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = this_01;
  std::vector<VkViewport,_std::allocator<VkViewport>_>::vector
            ((vector<VkViewport,_std::allocator<VkViewport>_> *)0x162788);
  local_3cb0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3cb0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3cb0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)this_01;
  std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
            ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)0x1627ae);
  local_3cb0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_3cb0.m_create_info.pNext = (void *)0x0;
  local_3cb0.m_create_info.flags = 0;
  local_3cb0.m_create_info.viewportCount = 0;
  local_3cb0.m_create_info.pViewports = (VkViewport *)0x0;
  local_3cb0.m_create_info.scissorCount = 0;
  local_3cb0.m_create_info.pScissors = (VkRect2D *)0x0;
  local_3cb0.m_enable = false;
  local_3c48.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_3c48.m_create_info.pNext = (void *)0x0;
  local_3c48.m_create_info.flags = 0;
  local_3c48.m_create_info.rasterizationSamples = 0;
  local_3c48.m_create_info.sampleShadingEnable = 0;
  local_3c48.m_create_info.minSampleShading = 0.0;
  local_3c48.m_create_info.pSampleMask = (VkSampleMask *)0x0;
  local_3c48.m_create_info.alphaToCoverageEnable = 0;
  local_3c48.m_create_info.alphaToOneEnable = 0;
  local_3c48.m_enable = false;
  local_3c10 = 0x19;
  local_3c08 = 0;
  local_3c00 = 0;
  local_3bfc = 0;
  local_3bf8 = 0;
  local_3bf4 = 0;
  local_3bf0 = 0;
  local_3bec = 0;
  uStack_3bd8 = 0;
  uStack_3be8 = 0;
  uStack_3be0 = SUB84(this_01,0);
  local_3bdc = (undefined4)((ulong)this_01 >> 0x20);
  uStack_3bbc = 0;
  uStack_3bcc = 0;
  local_3bb0 = 0;
  local_3bac = 0;
  local_3ba8 = 0;
  local_3ba0 = 0;
  local_3b90._0_8_ = 0;
  pVStack_3bd4 = this_01;
  uStack_3bc4 = uStack_3be0;
  local_3bc0 = local_3bdc;
  pVStack_3bb8 = this_01;
  pVStack_3b98 = this_01;
  std::
  vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ::vector((vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
            *)0x162930);
  local_3b90[2] = 3.64338e-44;
  local_3b80 = 0;
  local_3b78 = 0;
  local_3b74 = 0;
  local_3b70 = 0;
  local_3b6c = 0;
  local_3b68 = 0;
  local_3b60 = 0;
  local_3b50 = 0;
  local_3b48.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b48.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVStack_3b58 = this_01;
  local_3b48.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)this_01;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)0x1629b5);
  local_3b30 = 0x1b;
  local_3b28 = 0;
  local_3b20 = 0;
  local_3b1c = 0;
  local_3b18 = 0;
  local_3b10 = 0;
  myvk::GraphicsPipelineState::VertexInputState::Enable(this_02);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            ((InputAssemblyState *)&stack0xffffffffffffc308,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_3cb0,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            (&local_3da0,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1);
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_3c48,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable
            ((ColorBlendState *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
             in_stack_ffffffffffffc22c,in_stack_ffffffffffffc228);
  dynamic_states = &local_3b48;
  this_00 = (GraphicsPipelineState *)&stack0xffffffffffffc22f;
  std::allocator<VkDynamicState>::allocator((allocator<VkDynamicState> *)0x162ab4);
  __l_00._M_len = (size_type)ppcVar3;
  __l_00._M_array = &pVVar2->sType;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            (this_03,__l_00,(allocator_type *)__a);
  myvk::GraphicsPipelineState::DynamicState::Enable((DynamicState *)this_00,dynamic_states);
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::~vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)this_01);
  std::allocator<VkDynamicState>::~allocator((allocator<VkDynamicState> *)&stack0xffffffffffffc22f);
  myvk::GraphicsPipeline::Create
            ((Ptr<PipelineLayout> *)CONCAT44(in_stack_ffffffffffffc30c,VVar7),
             (Ptr<RenderPass> *)CONCAT71(in_stack_ffffffffffffc301,bVar6),
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)shader_stages_00,(GraphicsPipelineState *)CONCAT44(in_stack_ffffffffffffc2f4,uVar5),
             uVar4);
  std::shared_ptr<myvk::GraphicsPipeline>::operator=
            ((shared_ptr<myvk::GraphicsPipeline> *)this_00,
             (shared_ptr<myvk::GraphicsPipeline> *)dynamic_states);
  std::shared_ptr<myvk::GraphicsPipeline>::~shared_ptr
            ((shared_ptr<myvk::GraphicsPipeline> *)0x162b57);
  myvk::GraphicsPipelineState::~GraphicsPipelineState(this_00);
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           *)this_01);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x162b7e);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x162b8b);
  std::shared_ptr<myvk::Device>::~shared_ptr((shared_ptr<myvk::Device> *)0x162b98);
  return;
}

Assistant:

void OctreeTracer::create_main_graphics_pipeline(const std::shared_ptr<myvk::RenderPass> &render_pass,
                                                 uint32_t subpass) {
	constexpr uint32_t kOctreeTracerFragSpv[] = {
#include "spirv/octree_tracer.frag.u32"
	};
	std::shared_ptr<myvk::Device> device = render_pass->GetDevicePtr();

	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module = myvk::ShaderModule::Create(device, kQuadVertSpv, sizeof(kQuadVertSpv));
	frag_shader_module = myvk::ShaderModule::Create(device, kOctreeTracerFragSpv, sizeof(kOctreeTracerFragSpv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable();
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_main_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_main_pipeline_layout, render_pass, shader_stages, pipeline_state, subpass);
}